

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StrongWeakAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StrongWeakAssertionExpr,slang::ast::AssertionExpr_const&,slang::ast::StrongWeakAssertionExpr::Strength>
          (BumpAllocator *this,AssertionExpr *args,Strength *args_1)

{
  Strength SVar1;
  StrongWeakAssertionExpr *pSVar2;
  
  pSVar2 = (StrongWeakAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StrongWeakAssertionExpr *)this->endPtr < pSVar2 + 1) {
    pSVar2 = (StrongWeakAssertionExpr *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pSVar2 + 1);
  }
  SVar1 = *args_1;
  (pSVar2->super_AssertionExpr).kind = StrongWeak;
  (pSVar2->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pSVar2->expr = args;
  pSVar2->strength = SVar1;
  return pSVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }